

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchSseImmediate(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                            ND_UINT8 SseImmSize)

{
  ND_UINT8 SseImmSize_local;
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (Size < (ulong)Offset + (ulong)SseImmSize) {
    Instrux_local._4_4_ = 0x80000001;
  }
  else {
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xffefffff | 0x100000;
    *(ushort *)&Instrux->field_0x14 = *(ushort *)&Instrux->field_0x14 & 0xf0ff | (Offset & 0xf) << 8
    ;
    Instrux->field_76 = *(anon_union_1_2_a701ec8c_for__INSTRUX_91 *)(Code + (int)(uint)Offset);
    Instrux->Length = Instrux->Length + SseImmSize;
    if (Instrux->Length < 0x10) {
      Instrux_local._4_4_ = 0;
    }
    else {
      Instrux_local._4_4_ = 0x80000003;
    }
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdFetchSseImmediate(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 SseImmSize
    )
{
    RET_GT((ND_SIZET)Offset + SseImmSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasSseImm = ND_TRUE;
    Instrux->SseImmOffset = Offset;
    Instrux->SseImmediate = *(Code + Offset);

    Instrux->Length += SseImmSize;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}